

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_transaction.cpp
# Opt level: O3

void __thiscall Transaction_GetRoInt_Test::TestBody(Transaction_GetRoInt_Test *this)

{
  TypedExpectation<std::shared_ptr<const_void>_(pstore::address,_unsigned_long,_bool,_bool)>
  *this_00;
  mock_database *addr;
  mock_mutex mutex;
  transaction<std::unique_lock<mock_mutex>_> transaction;
  _Any_data local_110;
  code *local_100;
  code *local_f8;
  MatcherBase<bool> local_f0;
  MatcherBase<bool> local_d8;
  MatcherBase<unsigned_long> local_c0;
  MatcherBase<pstore::address> local_a8;
  undefined1 local_90 [16];
  MockSpec<std::shared_ptr<const_void>_(pstore::address,_unsigned_long,_bool,_bool)> local_80;
  
  testing::Matcher<pstore::address>::Matcher((Matcher<pstore::address> *)&local_a8,(address)0x0);
  testing::Matcher<unsigned_long>::Matcher((Matcher<unsigned_long> *)&local_c0,4);
  testing::Matcher<bool>::Matcher((Matcher<bool> *)&local_d8,true);
  testing::Matcher<bool>::Matcher((Matcher<bool> *)&local_f0,false);
  addr = &(this->super_Transaction).db_;
  anon_unknown.dwarf_40a165::mock_database::gmock_get
            ((MockSpec<std::shared_ptr<const_void>_(pstore::address,_unsigned_long,_bool,_bool)> *)
             (local_90 + 0x10),addr,(Matcher<pstore::address> *)&local_a8,
             (Matcher<unsigned_long> *)&local_c0,(Matcher<bool> *)&local_d8,
             (Matcher<bool> *)&local_f0);
  testing::internal::GetWithoutMatchers();
  this_00 = testing::internal::
            MockSpec<std::shared_ptr<const_void>_(pstore::address,_unsigned_long,_bool,_bool)>::
            InternalExpectedAt((MockSpec<std::shared_ptr<const_void>_(pstore::address,_unsigned_long,_bool,_bool)>
                                *)(local_90 + 0x10),
                               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/core/test_transaction.cpp"
                               ,0x1c6,"db_",
                               "get (pstore::address::null (), sizeof (int), true, false)");
  local_110._M_unused._M_object = operator_new(0x18);
  *(mock_database **)local_110._M_unused._0_8_ = addr;
  *(code **)((long)local_110._M_unused._0_8_ + 8) =
       anon_unknown.dwarf_40a165::mock_database::base_get;
  *(long *)((long)local_110._M_unused._0_8_ + 0x10) = 0;
  local_110._8_8_ = 0;
  local_100 = std::
              _Function_handler<std::shared_ptr<const_void>_(pstore::address,_unsigned_long,_bool,_bool),_testing::internal::InvokeMethodAction<(anonymous_namespace)::mock_database,_std::shared_ptr<const_void>_((anonymous_namespace)::mock_database::*)(const_pstore::address_&,_unsigned_long,_bool,_bool)_const>_>
              ::_M_manager;
  local_f8 = std::
             _Function_handler<std::shared_ptr<const_void>_(pstore::address,_unsigned_long,_bool,_bool),_testing::internal::InvokeMethodAction<(anonymous_namespace)::mock_database,_std::shared_ptr<const_void>_((anonymous_namespace)::mock_database::*)(const_pstore::address_&,_unsigned_long,_bool,_bool)_const>_>
             ::_M_invoke;
  testing::internal::
  TypedExpectation<std::shared_ptr<const_void>_(pstore::address,_unsigned_long,_bool,_bool)>::
  WillOnce(this_00,(Action<std::shared_ptr<const_void>_(pstore::address,_unsigned_long,_bool,_bool)>
                    *)&local_110);
  if (local_100 != (code *)0x0) {
    (*local_100)(&local_110,&local_110,__destroy_functor);
  }
  testing::internal::MatcherBase<pstore::address>::~MatcherBase
            ((MatcherBase<pstore::address> *)
             &local_80.matchers_.
              super__Tuple_impl<0UL,_testing::Matcher<pstore::address>,_testing::Matcher<unsigned_long>,_testing::Matcher<bool>,_testing::Matcher<bool>_>
              .super__Head_base<0UL,_testing::Matcher<pstore::address>,_false>);
  testing::internal::MatcherBase<unsigned_long>::~MatcherBase
            ((MatcherBase<unsigned_long> *)
             ((long)&local_80.matchers_.
                     super__Tuple_impl<0UL,_testing::Matcher<pstore::address>,_testing::Matcher<unsigned_long>,_testing::Matcher<bool>,_testing::Matcher<bool>_>
                     .
                     super__Tuple_impl<1UL,_testing::Matcher<unsigned_long>,_testing::Matcher<bool>,_testing::Matcher<bool>_>
             + 0x30));
  testing::internal::MatcherBase<bool>::~MatcherBase
            ((MatcherBase<bool> *)
             ((long)&local_80.matchers_.
                     super__Tuple_impl<0UL,_testing::Matcher<pstore::address>,_testing::Matcher<unsigned_long>,_testing::Matcher<bool>,_testing::Matcher<bool>_>
                     .
                     super__Tuple_impl<1UL,_testing::Matcher<unsigned_long>,_testing::Matcher<bool>,_testing::Matcher<bool>_>
             + 0x18));
  testing::internal::MatcherBase<bool>::~MatcherBase((MatcherBase<bool> *)&local_80.matchers_);
  testing::internal::MatcherBase<bool>::~MatcherBase(&local_f0);
  testing::internal::MatcherBase<bool>::~MatcherBase(&local_d8);
  testing::internal::MatcherBase<unsigned_long>::~MatcherBase(&local_c0);
  testing::internal::MatcherBase<pstore::address>::~MatcherBase(&local_a8);
  local_110._8_8_ = local_110._8_8_ & 0xffffffffffffff00;
  local_110._M_unused._M_object = &local_a8;
  std::unique_lock<mock_mutex>::lock((unique_lock<mock_mutex> *)&local_110);
  local_110._M_pod_data[8] = 1;
  pstore::transaction<std::unique_lock<mock_mutex>_>::transaction
            ((transaction<std::unique_lock<mock_mutex>_> *)(local_90 + 0x10),&addr->super_database,
             (lock_type *)&local_110);
  pstore::database::getro<int,void>((database *)local_90,(typed_address<int>)addr,0);
  if ((_Head_base<0UL,_std::array<pstore::sat_entry,_65536UL>_*,_false>)local_90._8_8_ !=
      (_Head_base<0UL,_std::array<pstore::sat_entry,_65536UL>_*,_false>)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_90._8_8_);
  }
  pstore::transaction_base::commit((transaction_base *)(local_90 + 0x10));
  local_80.function_mocker_ =
       (FunctionMocker<std::shared_ptr<const_void>_(pstore::address,_unsigned_long,_bool,_bool)> *)
       &PTR__transaction_0026b340;
  pstore::transaction_base::rollback((transaction_base *)(local_90 + 0x10));
  return;
}

Assistant:

TEST_F (Transaction, GetRoInt) {
    // First setup the mock expectations.
    EXPECT_CALL (db_, get (pstore::address::null (), sizeof (int), true, false))
        .WillOnce (::testing::Invoke (&db_, &mock_database::base_get));

    // Now the real body of the test
    {
        mock_mutex mutex;
        auto transaction = begin (db_, std::unique_lock<mock_mutex>{mutex});
        db_.getro (pstore::typed_address<int>::null (), 1);
        transaction.commit ();
    }
}